

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testHash(char *name)

{
  uint uVar1;
  char *__s2;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    __s2 = *(char **)((long)&g_hashes[0].name + lVar3);
    iVar2 = strcasecmp(name,__s2);
    if (iVar2 == 0) {
      uVar1 = *(uint *)((long)&g_hashes[0].hashbits + lVar3);
      g_hashUnderTest = (HashInfo *)((long)&g_hashes[0].hash + lVar3);
      switch(uVar1 - 0x20 >> 5 | uVar1 << 0x1b) {
      case 0:
        test<unsigned_int>((hashfunc<unsigned_int>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      case 1:
        test<unsigned_long>((hashfunc<unsigned_long>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      default:
        printf("Invalid hash bit width %d for hash \'%s\'",(ulong)uVar1,__s2);
        return;
      case 3:
        test<Blob<128>>((hashfunc<Blob<128>_>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      case 4:
        test<Blob<160>>((hashfunc<Blob<160>_>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      case 6:
        test<Blob<224>>((hashfunc<Blob<224>_>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      case 7:
        test<Blob<256>>((hashfunc<Blob<256>_>)g_hashUnderTest->hash,g_hashUnderTest);
        return;
      }
    }
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x1220);
  printf("Invalid hash \'%s\' specified\n",name);
  return;
}

Assistant:

void testHash ( const char * name )
{
  HashInfo * pInfo = findHash(name);

  if(pInfo == NULL)
  {
    printf("Invalid hash '%s' specified\n", name);
    return;
  }
  else
  {
    g_hashUnderTest = pInfo;

    if(pInfo->hashbits == 32)
    {
      test<uint32_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 64)
    {
      test<uint64_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 128)
    {
      test<uint128_t>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 160)
    {
      test<Blob<160>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 224)
    {
      test<Blob<224>>( pInfo->hash, pInfo );
    }
    else if(pInfo->hashbits == 256)
    {
      test<uint256_t>( pInfo->hash, pInfo );
    }
    else
    {
      printf("Invalid hash bit width %d for hash '%s'",
             pInfo->hashbits, pInfo->name);
    }
  }
}